

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O2

void __thiscall Control::begin(Control *this)

{
  time_t tVar1;
  Draw DrawUi;
  GameOperator Operator;
  GameData Data;
  Draw local_fd;
  GameOperator local_fc;
  undefined1 local_f8 [120];
  undefined1 local_80 [120];
  
  Draw::Draw(&local_fd);
  GameData::GameData((GameData *)local_80);
  GameOperator::GameOperator(&local_fc);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  GameData::GameData((GameData *)local_f8,(GameData *)local_80);
  loop();
  std::__cxx11::string::~string((string *)(local_f8 + 0x50));
  std::__cxx11::string::~string((string *)(local_80 + 0x50));
  return;
}

Assistant:

void Control::begin() {
    Draw DrawUi;
    GameData Data;
    GameOperator Operator;
    srand((unsigned) time(NULL));
    loop(Data, DrawUi, Operator);
}